

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O2

int __thiscall QOpenGLShaderProgram::link(QOpenGLShaderProgram *this,char *__from,char *__to)

{
  int iVar1;
  QOpenGLShaderProgramPrivate *this_00;
  long lVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  bool bVar6;
  int iVar7;
  undefined7 extraout_var;
  undefined8 uVar8;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar9;
  undefined8 extraout_RAX_02;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  GLint len;
  char *logbuf;
  GLint value;
  QArrayDataPointer<char16_t> local_98;
  char *local_80;
  QArrayDataPointer<char16_t> local_78;
  QByteArrayView local_58;
  undefined4 local_44;
  char *local_40;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QOpenGLShaderProgramPrivate **)&this->field_0x8;
  if ((this_00->programGuard == (QOpenGLSharedResourceGuard *)0x0) ||
     (iVar1 = *(int *)(this_00->programGuard + 0x10), iVar1 == 0)) {
    iVar7 = 0;
  }
  else {
    lVar2 = (this_00->shaders).d.size;
    if (this_00->linkBinaryRecursion == false) {
      if (lVar2 == 0) {
        if ((this_00->binaryProgram).shaders.d.size != 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            bVar6 = QOpenGLShaderProgramPrivate::linkBinary(this_00);
            return (int)CONCAT71(extraout_var,bVar6);
          }
          goto LAB_0014994a;
        }
        goto LAB_001496d0;
      }
      local_34 = -0x55555556;
    }
    else {
      local_34 = -0x55555556;
      if (lVar2 == 0) {
LAB_001496d0:
        local_34 = 0;
        uVar8 = (**(code **)(*(long *)this_00->glfuncs + 0x2a8))(iVar1,0x8b82,&local_34);
        this_00->linked = local_34 != 0;
        iVar7 = (int)CONCAT71((int7)((ulong)uVar8 >> 8),1);
        if (local_34 != 0) goto LAB_00149852;
      }
    }
    (**(code **)(*(long *)this_00->glfuncs + 0x338))(iVar1);
    local_34 = 0;
    (**(code **)(*(long *)this_00->glfuncs + 0x2a8))(iVar1,0x8b82,&local_34);
    this_00->linked = local_34 != 0;
    local_34 = 0;
    (**(code **)(*(long *)this_00->glfuncs + 0x2a8))(iVar1,0x8b84,&local_34);
    pDVar4 = (this_00->log).d.d;
    pcVar5 = (this_00->log).d.ptr;
    (this_00->log).d.d = (Data *)0x0;
    (this_00->log).d.ptr = (char16_t *)0x0;
    local_98.d._0_4_ = SUB84(pDVar4,0);
    local_98.d._4_4_ = (undefined4)((ulong)pDVar4 >> 0x20);
    local_98.ptr._0_4_ = SUB84(pcVar5,0);
    local_98.ptr._4_4_ = (undefined4)((ulong)pcVar5 >> 0x20);
    qVar3 = (this_00->log).d.size;
    (this_00->log).d.size = 0;
    local_98.size._0_4_ = (undefined4)qVar3;
    local_98.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    iVar7 = local_34;
    uVar8 = extraout_RAX;
    if (1 < (long)local_34) {
      local_40 = (char *)operator_new__((long)local_34);
      local_44 = 0xaaaaaaaa;
      (**(code **)(*(long *)this_00->glfuncs + 0x2b0))(iVar1,iVar7,&local_44,local_40);
      QByteArrayView::QByteArrayView<char_*,_true>(&local_58,&local_40);
      QVar10.m_data = (storage_type *)local_58.m_size;
      QVar10.m_size = (qsizetype)&local_98;
      QString::fromLatin1(QVar10);
      pDVar4 = (this_00->log).d.d;
      pcVar5 = (this_00->log).d.ptr;
      (this_00->log).d.d = (Data *)CONCAT44(local_98.d._4_4_,local_98.d._0_4_);
      (this_00->log).d.ptr = (char16_t *)CONCAT44(local_98.ptr._4_4_,local_98.ptr._0_4_);
      local_98.d._0_4_ = SUB84(pDVar4,0);
      local_98.d._4_4_ = (undefined4)((ulong)pDVar4 >> 0x20);
      local_98.ptr._0_4_ = SUB84(pcVar5,0);
      local_98.ptr._4_4_ = (undefined4)((ulong)pcVar5 >> 0x20);
      qVar3 = (this_00->log).d.size;
      (this_00->log).d.size = CONCAT44(local_98.size._4_4_,(undefined4)local_98.size);
      local_98.size._0_4_ = (undefined4)qVar3;
      local_98.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      uVar8 = extraout_RAX_00;
      if ((this_00->linked == false) && (this_00->linkBinaryRecursion == false)) {
        local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QObject::objectName();
        if ((undefined1 *)local_78.size == (undefined1 *)0x0) {
          local_98.d._0_4_ = 2;
          local_98.size._4_4_ = 0;
          local_98.d._4_4_ = 0;
          local_98.ptr._0_4_ = 0;
          local_98.ptr._4_4_ = 0;
          local_98.size._0_4_ = 0;
          local_80 = "default";
          uVar8 = QString::utf16();
          QMessageLogger::warning((char *)&local_98,"QOpenGLShader::link: %ls",uVar8);
        }
        else {
          local_98.d._0_4_ = 2;
          local_98.size._4_4_ = 0;
          local_98.d._4_4_ = 0;
          local_98.ptr._0_4_ = 0;
          local_98.ptr._4_4_ = 0;
          local_98.size._0_4_ = 0;
          local_80 = "default";
          uVar8 = QString::utf16();
          uVar9 = QString::utf16();
          QMessageLogger::warning((char *)&local_98,"QOpenGLShader::link[%ls]: %ls",uVar8,uVar9);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        uVar8 = extraout_RAX_02;
      }
      if (local_40 != (char *)0x0) {
        operator_delete__(local_40);
        uVar8 = extraout_RAX_01;
      }
    }
    iVar7 = (int)CONCAT71((int7)((ulong)uVar8 >> 8),this_00->linked);
  }
LAB_00149852:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar7;
  }
LAB_0014994a:
  __stack_chk_fail();
}

Assistant:

bool QOpenGLShaderProgram::link()
{
    Q_D(QOpenGLShaderProgram);
    GLuint program = d->programGuard ? d->programGuard->id() : 0;
    if (!program)
        return false;

    if (!d->linkBinaryRecursion && d->shaders.isEmpty() && !d->binaryProgram.shaders.isEmpty())
        return d->linkBinary();

    GLint value;
    if (d->shaders.isEmpty()) {
        // If there are no explicit shaders, then it is possible that the
        // application added a program binary with glProgramBinaryOES(), or
        // otherwise populated the shaders itself. This is also the case when
        // we are recursively called back from linkBinary() after a successful
        // glProgramBinary(). Check to see if the program is already linked and
        // bail out if so.
        value = 0;
        d->glfuncs->glGetProgramiv(program, GL_LINK_STATUS, &value);
        d->linked = (value != 0);
        if (d->linked)
            return true;
    }

    d->glfuncs->glLinkProgram(program);
    value = 0;
    d->glfuncs->glGetProgramiv(program, GL_LINK_STATUS, &value);
    d->linked = (value != 0);
    value = 0;
    d->glfuncs->glGetProgramiv(program, GL_INFO_LOG_LENGTH, &value);
    d->log = QString();
    if (value > 1) {
        char *logbuf = new char [value];
        GLint len;
        d->glfuncs->glGetProgramInfoLog(program, value, &len, logbuf);
        d->log = QString::fromLatin1(logbuf);
        if (!d->linked && !d->linkBinaryRecursion) {
            QString name = objectName();
            if (name.isEmpty())
                qWarning("QOpenGLShader::link: %ls", qUtf16Printable(d->log));
            else
                qWarning("QOpenGLShader::link[%ls]: %ls", qUtf16Printable(name), qUtf16Printable(d->log));
        }
        delete [] logbuf;
    }
    return d->linked;
}